

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,cmDuration timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  pointer pcVar6;
  char *pcVar7;
  char *pcVar8;
  difference_type __offset_2;
  char *pcVar9;
  difference_type __offset;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  double timeoutAsDbl;
  cmProcessOutput local_c1;
  int local_c0;
  int local_bc;
  string *local_b8;
  string local_b0;
  char *local_90;
  string local_88;
  string local_68;
  cmsysProcess *local_48;
  rep_conflict local_40;
  rep_conflict local_38;
  
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar7 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_b8 = line;
  local_48 = process;
  local_40 = timeout.__r;
  cmProcessOutput::cmProcessOutput(&local_c1,Auto,0x400);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  do {
    pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar10 = pcVar8;
    if (pcVar8 != pcVar9) {
      lVar12 = 0;
      do {
        pcVar11 = pcVar8 + lVar12 + 1;
        cVar1 = pcVar8[lVar12];
        if (cVar1 == '\r') {
          if (pcVar11 == pcVar9) {
            pcVar10 = pcVar8 + lVar12;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar7 = pcVar8 + (lVar12 - (long)pcVar6);
          if ((char *)0x1 < pcVar7) {
            pcVar7 = pcVar8 + (lVar12 - (long)(pcVar6 + (pcVar8[lVar12 + -1] == '\r')));
          }
          if (pcVar7 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_b8,(ulong)pcVar6);
          }
          pcVar7 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_c0 = 2;
          if (pcVar11 != pcVar7) {
            pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar11 != pcVar9) {
              memmove(pcVar7,pcVar11,(size_t)(pcVar9 + (~(ulong)pcVar8 - lVar12)));
            }
            pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar7 + (long)pcVar9 + (~(ulong)pcVar8 - lVar12) != pcVar9) {
              (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar7 + (long)pcVar9 + (~(ulong)pcVar8 - lVar12);
            }
          }
          goto LAB_002ee69a;
        }
        lVar12 = lVar12 + 1;
        pcVar10 = pcVar9;
      } while (pcVar11 != pcVar9);
    }
    pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar9 = pcVar7;
    if (pcVar7 != pcVar8) {
      lVar12 = 0;
      do {
        pcVar11 = pcVar7 + lVar12 + 1;
        cVar1 = pcVar7[lVar12];
        if (cVar1 == '\r') {
          if (pcVar11 == pcVar8) {
            pcVar9 = pcVar7 + lVar12;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar8 = pcVar7 + (lVar12 - (long)pcVar6);
          if ((char *)0x1 < pcVar8) {
            pcVar8 = pcVar7 + (lVar12 - (long)(pcVar6 + (pcVar7[lVar12 + -1] == '\r')));
          }
          if (pcVar8 != (char *)0x0) {
            std::__cxx11::string::append((char *)local_b8,(ulong)pcVar6);
          }
          pcVar8 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_c0 = 3;
          if (pcVar11 != pcVar8) {
            pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar11 != pcVar9) {
              memmove(pcVar8,pcVar11,(size_t)(pcVar9 + (~(ulong)pcVar7 - lVar12)));
            }
            pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar8 + (long)pcVar9 + (~(ulong)pcVar7 - lVar12) != pcVar9) {
              (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar8 + (long)pcVar9 + (~(ulong)pcVar7 - lVar12);
            }
          }
          goto LAB_002ee69a;
        }
        lVar12 = lVar12 + 1;
        pcVar9 = pcVar8;
      } while (pcVar11 != pcVar8);
    }
    local_38 = local_40;
    iVar5 = cmsysProcess_WaitForData(local_48,&local_90,&local_bc,&local_38);
    if (iVar5 < 3) {
      if (iVar5 != 0) {
        if (iVar5 == 2) {
          cmProcessOutput::DecodeText(&local_c1,local_90,(long)local_bc,&local_b0,1);
          pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<char,std::allocator<char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((vector<char,std::allocator<char>> *)out,pcVar6,local_b0._M_dataplus._M_p,
                     local_b0._M_dataplus._M_p + local_b0._M_string_length);
          pcVar10 = pcVar6 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                    super__Vector_impl_data._M_start - (long)pcVar2);
        }
        goto LAB_002ee53b;
      }
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      cmProcessOutput::DecodeText(&local_c1,&local_68,&local_b0,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
      if (local_b0._M_string_length != 0) {
        pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)out,pcVar6,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        pcVar10 = pcVar6 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start - (long)pcVar2);
      }
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      cmProcessOutput::DecodeText(&local_c1,&local_88,&local_b0,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if (local_b0._M_string_length != 0) {
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)err);
        pcVar9 = pcVar6 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar2);
      }
      pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar6 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar6 == (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          bVar4 = false;
          local_c0 = 0;
          goto LAB_002ee584;
        }
        std::__cxx11::string::append((char *)local_b8,(ulong)pcVar6);
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_c0 = 3;
        if ((pcVar6 != pcVar2) &&
           (pcVar3 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
           pcVar6 = pcVar6 + ((long)pcVar3 - (long)pcVar2), pcVar3 != pcVar6)) {
          (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar6;
        }
      }
      else {
        std::__cxx11::string::append((char *)local_b8,(ulong)pcVar6);
        pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        local_c0 = 2;
        if ((pcVar6 != pcVar2) &&
           (pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
           pcVar6 = pcVar6 + ((long)pcVar3 - (long)pcVar2), pcVar3 != pcVar6)) {
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar6;
        }
      }
      bVar4 = false;
    }
    else {
      if (iVar5 == 3) {
        cmProcessOutput::DecodeText(&local_c1,local_90,(long)local_bc,&local_b0,2);
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar2 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)err,pcVar6,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        pcVar9 = pcVar6 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar2);
      }
      else if (iVar5 == 0xff) {
        bVar4 = false;
        local_c0 = 0xff;
        goto LAB_002ee584;
      }
LAB_002ee53b:
      bVar4 = true;
    }
LAB_002ee584:
    pcVar7 = pcVar9;
    pcVar8 = pcVar10;
    if (!bVar4) {
LAB_002ee69a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      return local_c0;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               cmDuration timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line.clear();
  auto outiter = out.begin();
  auto erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(out.data(), length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(err.data(), length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    double timeoutAsDbl = timeout.count();
    int pipe =
      cmsysProcess_WaitForData(process, &data, &length, &timeoutAsDbl);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      cm::append(out, strdata);
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      cm::append(err, strdata);
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        cm::append(out, strdata);
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        cm::append(err, strdata);
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(out.data(), outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(err.data(), erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}